

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderReadOuterXml(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  xmlOutputBufferPtr output_00;
  xmlChar *ret;
  xmlNodePtr node;
  xmlOutputBufferPtr output;
  xmlTextReaderPtr reader_local;
  
  pxVar1 = xmlTextReaderExpand(reader);
  if (pxVar1 == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    pxVar1 = reader->node;
    if (pxVar1 == (xmlNodePtr)0x0) {
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else {
      output_00 = xmlAllocOutputBuffer((xmlCharEncodingHandlerPtr)0x0);
      if (output_00 == (xmlOutputBufferPtr)0x0) {
        xmlTextReaderErrMemory(reader);
        reader_local = (xmlTextReaderPtr)0x0;
      }
      else {
        xmlTextReaderDumpCopy(reader,output_00,pxVar1);
        if (output_00->error != 0) {
          xmlCtxtErrIO(reader->ctxt,output_00->error,(char *)0x0);
        }
        reader_local = (xmlTextReaderPtr)xmlBufDetach(output_00->buffer);
        xmlOutputBufferClose(output_00);
      }
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderReadOuterXml(xmlTextReaderPtr reader)
{
    xmlOutputBufferPtr output;
    xmlNodePtr node;
    xmlChar *ret;

    if (xmlTextReaderExpand(reader) == NULL)
        return(NULL);

    node = reader->node;
    if (node == NULL)
        return(NULL);

    output = xmlAllocOutputBuffer(NULL);
    if (output == NULL) {
        xmlTextReaderErrMemory(reader);
        return(NULL);
    }

    xmlTextReaderDumpCopy(reader, output, node);
    if (output->error)
        xmlCtxtErrIO(reader->ctxt, output->error, NULL);

    ret = xmlBufDetach(output->buffer);
    xmlOutputBufferClose(output);

    return(ret);
}